

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

QEasingCurveFunction * curveToFunctionObject(Type type)

{
  undefined **ppuVar1;
  BezierEase *this;
  QEasingCurveFunction *pQVar2;
  
  switch(type) {
  case InElastic:
  case OutElastic:
  case InOutElastic:
  case OutInElastic:
    pQVar2 = (QEasingCurveFunction *)operator_new(0x58);
    pQVar2->_t = type;
    pQVar2->_p = 0.3;
    pQVar2->_a = 1.0;
    pQVar2->_o = 1.70158;
    (pQVar2->_bezierCurves).d.d = 0;
    *(QPointF **)((long)&(pQVar2->_bezierCurves).d + 8) = (QPointF *)0x0;
    *(qsizetype *)((long)&(pQVar2->_bezierCurves).d + 0x10) = 0;
    (pQVar2->_tcbPoints).d.d = 0;
    *(TCBPoint **)((long)&(pQVar2->_tcbPoints).d + 8) = (TCBPoint *)0x0;
    *(qsizetype *)((long)&(pQVar2->_tcbPoints).d + 0x10) = 0;
    ppuVar1 = &PTR__QEasingCurveFunction_00669698;
    break;
  case InBack:
  case OutBack:
  case InOutBack:
  case OutInBack:
    pQVar2 = (QEasingCurveFunction *)operator_new(0x58);
    pQVar2->_t = type;
    pQVar2->_p = 0.3;
    pQVar2->_a = 1.0;
    pQVar2->_o = 1.70158;
    (pQVar2->_bezierCurves).d.d = 0;
    *(QPointF **)((long)&(pQVar2->_bezierCurves).d + 8) = (QPointF *)0x0;
    *(qsizetype *)((long)&(pQVar2->_bezierCurves).d + 0x10) = 0;
    (pQVar2->_tcbPoints).d.d = 0;
    *(TCBPoint **)((long)&(pQVar2->_tcbPoints).d + 8) = (TCBPoint *)0x0;
    *(qsizetype *)((long)&(pQVar2->_tcbPoints).d + 0x10) = 0;
    ppuVar1 = &PTR__QEasingCurveFunction_00669728;
    break;
  case InBounce:
  case OutBounce:
  case InOutBounce:
  case OutInBounce:
    pQVar2 = (QEasingCurveFunction *)operator_new(0x58);
    pQVar2->_t = type;
    pQVar2->_p = 0.3;
    pQVar2->_a = 1.0;
    pQVar2->_o = 1.70158;
    (pQVar2->_bezierCurves).d.d = 0;
    *(QPointF **)((long)&(pQVar2->_bezierCurves).d + 8) = (QPointF *)0x0;
    *(qsizetype *)((long)&(pQVar2->_bezierCurves).d + 0x10) = 0;
    (pQVar2->_tcbPoints).d.d = 0;
    *(TCBPoint **)((long)&(pQVar2->_tcbPoints).d + 8) = (TCBPoint *)0x0;
    *(qsizetype *)((long)&(pQVar2->_tcbPoints).d + 0x10) = 0;
    ppuVar1 = &PTR__QEasingCurveFunction_006696e0;
    break;
  default:
    pQVar2 = (QEasingCurveFunction *)operator_new(0x58);
    pQVar2->_vptr_QEasingCurveFunction = (_func_int **)&PTR__QEasingCurveFunction_006694f0;
    pQVar2->_t = type;
    pQVar2->_p = 0.3;
    pQVar2->_a = 1.0;
    pQVar2->_o = 1.70158;
    (pQVar2->_bezierCurves).d.d = 0;
    *(QPointF **)((long)&(pQVar2->_bezierCurves).d + 8) = (QPointF *)0x0;
    *(qsizetype *)((long)&(pQVar2->_bezierCurves).d + 0x10) = 0;
    (pQVar2->_tcbPoints).d.d = 0;
    *(TCBPoint **)((long)&(pQVar2->_tcbPoints).d + 8) = (TCBPoint *)0x0;
    *(qsizetype *)((long)&(pQVar2->_tcbPoints).d + 0x10) = 0;
    return pQVar2;
  case BezierSpline:
    this = (BezierEase *)operator_new(0x90);
    BezierEase::BezierEase(this,BezierSpline);
    return &this->super_QEasingCurveFunction;
  case TCBSpline:
    pQVar2 = (QEasingCurveFunction *)operator_new(0x90);
    TCBEase::TCBEase((TCBEase *)pQVar2);
    return pQVar2;
  }
  pQVar2->_vptr_QEasingCurveFunction = (_func_int **)ppuVar1;
  return pQVar2;
}

Assistant:

static QEasingCurveFunction *curveToFunctionObject(QEasingCurve::Type type)
{
    switch (type) {
    case QEasingCurve::InElastic:
    case QEasingCurve::OutElastic:
    case QEasingCurve::InOutElastic:
    case QEasingCurve::OutInElastic:
        return new ElasticEase(type);
    case QEasingCurve::OutBounce:
    case QEasingCurve::InBounce:
    case QEasingCurve::OutInBounce:
    case QEasingCurve::InOutBounce:
        return new BounceEase(type);
    case QEasingCurve::InBack:
    case QEasingCurve::OutBack:
    case QEasingCurve::InOutBack:
    case QEasingCurve::OutInBack:
        return new BackEase(type);
    case QEasingCurve::BezierSpline:
        return new BezierEase;
    case QEasingCurve::TCBSpline:
        return new TCBEase;
    default:
        return new QEasingCurveFunction(type, qreal(0.3), qreal(1.0), qreal(1.70158));
    }

    return nullptr;
}